

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

double hcephes_cosm1(double x)

{
  double dVar1;
  double dVar2;
  double xx;
  double x_local;
  
  if ((x < -0.7853981633974483) || (0.7853981633974483 < x)) {
    dVar1 = cos(x);
    x_local = dVar1 - 1.0;
  }
  else {
    dVar1 = x * x;
    dVar2 = hcephes_polevl(dVar1,coscof,6);
    x_local = dVar1 * -0.5 + dVar1 * dVar1 * dVar2;
  }
  return x_local;
}

Assistant:

HCEPHES_API double hcephes_cosm1(double x) {
    double xx;

    if ((x < -HCEPHES_PIO4) || (x > HCEPHES_PIO4))
        return (cos(x) - 1.0);
    xx = x * x;
    xx = -0.5 * xx + xx * xx * hcephes_polevl(xx, coscof, 6);
    return xx;
}